

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::dimensions_abi_cxx11_(string *__return_storage_ptr__,units *this,precise_unit *units)

{
  precise_unit *ppVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  precise_unit *other;
  precise_unit base;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  precise_unit local_30;
  
  if (((byte)this[0xb] & 0x10) == 0) {
    iVar3 = detail::unit_data::unit_type_count((unit_data *)(this + 8));
    if (iVar3 != 0) {
      local_30.base_units_ = *(unit_data *)(this + 8);
      local_30.multiplier_ = 1.0;
      local_30.commodity_ = 0;
      lVar5 = 0x1788;
      ppVar1 = (precise_unit *)&DAT_001ca660;
      while (other = ppVar1, lVar5 != 0) {
        bVar2 = precise_unit::operator==(&local_30,other);
        lVar5 = lVar5 + -0x18;
        ppVar1 = (precise_unit *)&other[1].base_units_;
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_50,"[",&local_71);
          std::operator+(&local_70,&local_50,*(char **)&other[-1].base_units_);
          std::operator+(__return_storage_ptr__,&local_70,"]");
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          return __return_storage_ptr__;
        }
      }
      pcVar4 = "[unknown]";
      goto LAB_00173d7c;
    }
  }
  pcVar4 = "[dimensionless]";
LAB_00173d7c:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string dimensions(const precise_unit& units)
{
    if (units.is_per_unit() || units.unit_type_count() == 0) {
        return "[dimensionless]";
    }

    precise_unit base(1.0, units.base_units());
    for (const auto& mt : defined_measurement_types) {
        if (base == mt.second) {
            return std::string("[") + mt.first + "]";
        }
    }
    // Now it isn't something common so lets just build a sequence TODO(PT):
    return "[unknown]";
}